

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMipsInstruction.h
# Opt level: O2

void __thiscall MipsRegisterData::reset(MipsRegisterData *this)

{
  (this->grd).num = -1;
  (this->grt).num = -1;
  (this->grs).num = -1;
  (this->frd).num = -1;
  (this->frt).num = -1;
  (this->frs).num = -1;
  (this->vrd).num = -1;
  (this->vrt).num = -1;
  (this->vrs).num = -1;
  (this->ps2vrd).num = -1;
  (this->ps2vrt).num = -1;
  (this->ps2vrs).num = -1;
  (this->rspvrd).num = -1;
  (this->rspvrt).num = -1;
  (this->rspvrs).num = -1;
  (this->rspvealt).num = -1;
  (this->rspvde).num = -1;
  (this->rspve).num = -1;
  return;
}

Assistant:

void reset()
	{
		grs.num = grt.num = grd.num = -1;
		frs.num = frt.num = frd.num = -1;
		vrs.num = vrt.num = vrd.num = -1;
		ps2vrs.num = ps2vrt.num = ps2vrd.num = -1;
		rspvrs.num = rspvrt.num = rspvrd.num = -1;
		rspve.num = rspvde.num = rspvealt.num = -1;
	}